

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O2

_Bool chck_utf8_validate(char *u8)

{
  byte bVar1;
  uint32_t uVar2;
  uint8_t i;
  ulong uVar3;
  uint32_t cp;
  uint32_t state;
  
  if (u8 == (char *)0x0) {
    __assert_fail("u8",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/unicode/unicode.c"
                  ,0x78,"_Bool chck_utf8_validate(const char *)");
  }
  bVar1 = chck_utf8_mblen(u8);
  state = 0;
  for (uVar3 = 0; bVar1 != uVar3; uVar3 = uVar3 + 1) {
    uVar2 = chck_utf8_decode(&state,&cp,u8[uVar3]);
    if (uVar2 == 1) goto LAB_0010138c;
  }
  uVar3 = (ulong)bVar1;
LAB_0010138c:
  return (byte)(bVar1 - 1) < (byte)uVar3;
}

Assistant:

bool
chck_utf8_validate(const char u8[4])
{
   assert(u8);

   const uint8_t mb = chck_utf8_mblen(u8);
   uint32_t state = CHCK_UTF8_ACCEPT, cp;
   for (uint8_t i = 0; i < mb; ++i) {
      if (chck_utf8_decode(&state, &cp, u8[i]) == CHCK_UTF8_REJECT)
         return false;
   }

   return (mb > 0);
}